

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gla_ManRollBack(Gla_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  Gla_Obj_t *pGVar9;
  
  pVVar6 = p->vAddedNew;
  if (1 < pVVar6->nSize) {
    piVar2 = pVVar6->pArray;
    lVar5 = 1;
    do {
      iVar7 = piVar2[lVar5 + -1];
      lVar8 = (long)iVar7;
      if ((lVar8 < 0) || (p->nObjs <= iVar7)) goto LAB_0056b651;
      if (iVar7 == 0) {
        pGVar9 = (Gla_Obj_t *)0x0;
      }
      else {
        pGVar9 = p->pObjs + lVar8;
      }
      uVar3 = piVar2[lVar5];
      if (((int)uVar3 < 0) || ((pGVar9->vFrames).nSize <= (int)uVar3)) goto LAB_0056b670;
      if ((pGVar9->vFrames).pArray[uVar3] < 1) {
        __assert_fail("Vec_IntEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x582,"void Gla_ManRollBack(Gla_Man_t *)");
      }
      if (iVar7 == 0) {
        pGVar9 = (Gla_Obj_t *)0x0;
      }
      else {
        pGVar9 = p->pObjs + lVar8;
      }
      if ((pGVar9->vFrames).nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pGVar9->vFrames).pArray[uVar3] = 0;
      lVar5 = lVar5 + 2;
    } while ((int)lVar5 < pVVar6->nSize);
  }
  uVar3 = p->nAbsOld;
  uVar4 = (ulong)uVar3;
  pVVar6 = p->vAbs;
  iVar7 = pVVar6->nSize;
  if ((int)uVar3 < iVar7) {
    do {
      if ((int)uVar3 < 0) {
LAB_0056b670:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar6->pArray[uVar4];
      lVar5 = (long)iVar7;
      if ((lVar5 < 0) || (p->nObjs <= iVar7)) {
LAB_0056b651:
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
      }
      if (iVar7 == 0) {
LAB_0056b68f:
        __assert_fail("Gla_ManObj( p, iObj )->fAbs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x587,"void Gla_ManRollBack(Gla_Man_t *)");
      }
      uVar1 = *(uint *)&p->pObjs[lVar5].field_0x4;
      if ((uVar1 & 1) == 0) goto LAB_0056b68f;
      *(uint *)&p->pObjs[lVar5].field_0x4 = uVar1 & 0xfffffffe;
      uVar4 = uVar4 + 1;
      pVVar6 = p->vAbs;
      iVar7 = pVVar6->nSize;
    } while ((int)uVar4 < iVar7);
    uVar3 = p->nAbsOld;
  }
  if (iVar7 < (int)uVar3) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar6->nSize = uVar3;
  return;
}

Assistant:

void Gla_ManRollBack( Gla_Man_t * p )
{
    int i, iObj, iFrame;
    Vec_IntForEachEntryDouble( p->vAddedNew, iObj, iFrame, i )
    {
        assert( Vec_IntEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame ) > 0 );
        Vec_IntWriteEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame, 0 );
    }
    Vec_IntForEachEntryStart( p->vAbs, iObj, i, p->nAbsOld )
    {
        assert( Gla_ManObj( p, iObj )->fAbs == 1 );
        Gla_ManObj( p, iObj )->fAbs = 0;
    }
    Vec_IntShrink( p->vAbs, p->nAbsOld );
}